

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O2

int knet_close(knetFile *fp)

{
  if (fp != (knetFile *)0x0) {
    if (fp->ctrl_fd != -1) {
      close(fp->ctrl_fd);
    }
    if (fp->fd != -1) {
      close(fp->fd);
    }
    free(fp->host);
    free(fp->port);
    free(fp->response);
    free(fp->retr);
    free(fp->path);
    free(fp->http_host);
    free(fp);
  }
  return 0;
}

Assistant:

int knet_close(knetFile *fp)
{
	if (fp == 0) return 0;
	if (fp->ctrl_fd != -1) netclose(fp->ctrl_fd); // FTP specific
	if (fp->fd != -1) {
		/* On Linux/Mac, netclose() is an alias of close(), but on
		 * Windows, it is an alias of closesocket(). */
		if (fp->type == KNF_TYPE_LOCAL) close(fp->fd);
		else netclose(fp->fd);
	}
	free(fp->host); free(fp->port);
	free(fp->response); free(fp->retr); // FTP specific
	free(fp->path); free(fp->http_host); // HTTP specific
	free(fp);
	return 0;
}